

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this)

{
  bool bVar1;
  int iVar2;
  ON_BrepFace *F_00;
  ON_BrepFace *F;
  int i;
  bool rc;
  ON_Brep *this_local;
  
  F._7_1_ = false;
  for (F._0_4_ = 0;
      iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
      (int)F < iVar2; F._0_4_ = (int)F + 1) {
    F_00 = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&this->m_F,(int)F);
    if ((F_00->m_face_index == (int)F) && (bVar1 = RemoveSlits(this,F_00), bVar1)) {
      F._7_1_ = true;
    }
  }
  return F._7_1_;
}

Assistant:

bool ON_Brep::RemoveSlits()

{
  bool rc = false;
  int i;
  for (i=0; i<m_F.Count(); i++){
    ON_BrepFace& F = m_F[i];
    if (F.m_face_index != i) continue;
    if (RemoveSlits(F))
      rc = true;
  }
  return rc;
}